

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O2

bool __thiscall
de::cmdline::detail::Parser::parse
          (Parser *this,int numArgs,char **args,CommandLine *dst,ostream *err)

{
  char cVar1;
  OptMap *pOVar2;
  undefined8 uVar3;
  uint uVar4;
  mapped_type *ppOVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  const_iterator cVar9;
  iterator iVar10;
  ostream *poVar11;
  Entry *pEVar12;
  byte bVar13;
  char *pcVar14;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  *this_00;
  int iVar15;
  pointer pOVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  allocator<char> local_111;
  undefined4 local_110;
  int local_10c;
  ostream *local_108;
  OptInfo *opt;
  undefined1 local_f0 [48];
  OptSet seenOpts;
  OptMap longOptMap;
  OptMap shortOptMap;
  
  shortOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shortOptMap._M_t._M_impl.super__Rb_tree_header._M_header;
  shortOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shortOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shortOptMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  longOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &longOptMap._M_t._M_impl.super__Rb_tree_header._M_header;
  longOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  longOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  longOptMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  seenOpts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &seenOpts._M_t._M_impl.super__Rb_tree_header._M_header;
  seenOpts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seenOpts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  seenOpts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_10c = numArgs;
  local_108 = err;
  seenOpts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       seenOpts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  longOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       longOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  shortOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shortOptMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pOVar16 = (this->m_options).
                 super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pOVar16 !=
      (this->m_options).
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish; pOVar16 = pOVar16 + 1) {
    if (pOVar16->shortName != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opt,pOVar16->shortName,&local_111);
      ppOVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                ::operator[](&shortOptMap,(key_type *)&opt);
      *ppOVar5 = pOVar16;
      std::__cxx11::string::~string((string *)&opt);
    }
    if (pOVar16->longName != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opt,pOVar16->longName,&local_111);
      ppOVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                ::operator[](&longOptMap,(key_type *)&opt);
      *ppOVar5 = pOVar16;
      std::__cxx11::string::~string((string *)&opt);
    }
    if (pOVar16->defaultValue == (char *)0x0) {
      if (pOVar16->setDefault != (SetDefaultFunc)0x0) {
        (*pOVar16->setDefault)(&dst->m_options);
      }
    }
    else {
      (*pOVar16->dispatchParse)(pOVar16,pOVar16->defaultValue,&dst->m_options);
    }
  }
  local_f0._40_8_ = &dst->m_args;
  local_110 = (undefined4)CONCAT71((int7)((ulong)local_f0._40_8_ >> 8),1);
  uVar6 = 0;
  iVar15 = local_10c;
  local_f0._16_8_ = args;
  local_f0._24_8_ = dst;
  while( true ) {
    if (iVar15 <= (int)uVar6) goto LAB_0059113f;
    lVar17 = (long)(int)uVar6;
    pcVar14 = args[lVar17];
    local_f0._32_8_ = uVar6;
    sVar7 = strlen(pcVar14);
    uVar3 = local_f0._16_8_;
    if (*pcVar14 != '-') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&opt,pcVar14,&local_111);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_f0._40_8_,(key_type *)&opt);
      std::__cxx11::string::~string((string *)&opt);
      goto LAB_00590f89;
    }
    cVar1 = pcVar14[1];
    lVar19 = 1;
    if ((cVar1 == '-') && (lVar19 = 2, pcVar14[2] == '\0')) break;
    pcVar18 = pcVar14 + (int)sVar7;
    opt = (OptInfo *)CONCAT71(opt._1_7_,0x3d);
    pcVar8 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (pcVar14 + lVar19,pcVar18,(key_type *)&opt);
    opt = (OptInfo *)local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&opt,pcVar14 + lVar19,pcVar8);
    this_00 = &shortOptMap._M_t;
    if (cVar1 == '-') {
      this_00 = &longOptMap._M_t;
    }
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
            ::find(this_00,(key_type *)&opt);
    std::__cxx11::string::~string((string *)&opt);
    uVar6 = local_f0._32_8_;
    args = (char **)local_f0._16_8_;
    iVar15 = local_10c;
    pOVar2 = &shortOptMap;
    if (cVar1 == '-') {
      pOVar2 = &longOptMap;
    }
    if ((_Rb_tree_header *)cVar9._M_node == &(pOVar2->_M_t)._M_impl.super__Rb_tree_header) {
      opt = (OptInfo *)0x0;
LAB_00590f51:
      poVar11 = std::operator<<(local_108,"Unrecognized command line option \'");
      poVar11 = std::operator<<(poVar11,pcVar14);
      pcVar14 = "\'\n";
LAB_00590f74:
      std::operator<<(poVar11,pcVar14);
      local_110 = 0;
    }
    else {
      opt = *(OptInfo **)(cVar9._M_node + 2);
      if (opt == (OptInfo *)0x0) goto LAB_00590f51;
      iVar10 = std::
               _Rb_tree<const_de::cmdline::detail::Parser::OptInfo_*,_const_de::cmdline::detail::Parser::OptInfo_*,_std::_Identity<const_de::cmdline::detail::Parser::OptInfo_*>,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
               ::find(&seenOpts._M_t,&opt);
      if ((_Rb_tree_header *)iVar10._M_node != &seenOpts._M_t._M_impl.super__Rb_tree_header) {
        poVar11 = std::operator<<(local_108,"Command line option \'--");
        poVar11 = std::operator<<(poVar11,opt->longName);
        pcVar14 = "\' specified multiple times\n";
        goto LAB_00590f74;
      }
      std::
      _Rb_tree<de::cmdline::detail::Parser::OptInfo_const*,de::cmdline::detail::Parser::OptInfo_const*,std::_Identity<de::cmdline::detail::Parser::OptInfo_const*>,std::less<de::cmdline::detail::Parser::OptInfo_const*>,std::allocator<de::cmdline::detail::Parser::OptInfo_const*>>
      ::_M_insert_unique<de::cmdline::detail::Parser::OptInfo_const*const&>
                ((_Rb_tree<de::cmdline::detail::Parser::OptInfo_const*,de::cmdline::detail::Parser::OptInfo_const*,std::_Identity<de::cmdline::detail::Parser::OptInfo_const*>,std::less<de::cmdline::detail::Parser::OptInfo_const*>,std::allocator<de::cmdline::detail::Parser::OptInfo_const*>>
                  *)&seenOpts,&opt);
      if (opt->isFlag == true) {
        if (pcVar8 == pcVar18) {
          (*opt->dispatchParse)(opt,(char *)0x0,(TypedFieldMap *)local_f0._24_8_);
          local_f0._32_8_ = uVar6;
        }
        else {
          poVar11 = std::operator<<(local_108,"No value expected for command line option \'--");
          poVar11 = std::operator<<(poVar11,opt->longName);
          std::operator<<(poVar11,"\'\n");
LAB_0059102a:
          local_110 = 0;
          local_f0._32_8_ = uVar6;
        }
      }
      else {
        uVar4 = (int)uVar6 + 1;
        if ((iVar15 <= (int)uVar4) && (pcVar8 == pcVar18)) {
          poVar11 = std::operator<<(local_108,"Expected value for command line option \'--");
          poVar11 = std::operator<<(poVar11,opt->longName);
          std::operator<<(poVar11,"\'\n");
          goto LAB_0059102a;
        }
        if (pcVar8 == pcVar18) {
          pcVar8 = args[(int)uVar4];
          uVar6 = (ulong)uVar4;
        }
        else {
          pcVar8 = pcVar8 + 1;
        }
        (*opt->dispatchParse)(opt,pcVar8,(TypedFieldMap *)local_f0._24_8_);
        local_f0._32_8_ = uVar6;
      }
    }
LAB_00590f89:
    uVar6 = (ulong)((int)local_f0._32_8_ + 1);
  }
  lVar19 = (long)local_10c;
  while (lVar17 = lVar17 + 1, lVar17 < lVar19) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&opt,*(char **)(uVar3 + lVar17 * 8),&local_111);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f0._40_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt);
    std::__cxx11::string::~string((string *)&opt);
  }
LAB_0059113f:
  pEVar12 = TypedFieldMap::get((TypedFieldMap *)local_f0._24_8_,
                               (type_info *)&(anonymous_namespace)::Help::typeinfo);
  bVar13 = (*pEVar12->value ^ 1) & (byte)local_110;
  std::
  _Rb_tree<const_de::cmdline::detail::Parser::OptInfo_*,_const_de::cmdline::detail::Parser::OptInfo_*,_std::_Identity<const_de::cmdline::detail::Parser::OptInfo_*>,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  ::~_Rb_tree(&seenOpts._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~_Rb_tree(&longOptMap._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~_Rb_tree(&shortOptMap._M_t);
  return (bool)bVar13;
}

Assistant:

bool Parser::parse (int numArgs, const char* const* args, CommandLine* dst, std::ostream& err) const
{
	typedef map<string, const OptInfo*> OptMap;
	typedef set<const OptInfo*> OptSet;

	OptMap	shortOptMap;
	OptMap	longOptMap;
	OptSet	seenOpts;
	bool	allOk			= true;

	DE_ASSERT(dst->m_args.empty() && dst->m_options.empty());

	for (vector<OptInfo>::const_iterator optIter = m_options.begin(); optIter != m_options.end(); optIter++)
	{
		const OptInfo& opt = *optIter;

		DE_ASSERT(opt.shortName || opt.longName);

		if (opt.shortName)
		{
			DE_ASSERT(shortOptMap.find(opt.shortName) == shortOptMap.end());
			shortOptMap[opt.shortName] = &opt;
		}

		if (opt.longName)
		{
			DE_ASSERT(longOptMap.find(opt.longName) == longOptMap.end());
			longOptMap[opt.longName] = &opt;
		}

		// Set default values.
		if (opt.defaultValue)
			opt.dispatchParse(&opt, opt.defaultValue, &dst->m_options);
		else if (opt.setDefault)
			opt.setDefault(&dst->m_options);
	}

	DE_ASSERT(!dst->m_options.get<Help>());

	for (int argNdx = 0; argNdx < numArgs; argNdx++)
	{
		const char*		arg		= args[argNdx];
		int				argLen	= (int)strlen(arg);

		if (arg[0] == '-' && arg[1] == '-' && arg[2] == 0)
		{
			// End of option list (--)
			for (int optNdx = argNdx+1; optNdx < numArgs; optNdx++)
				dst->m_args.push_back(args[optNdx]);
			break;
		}
		else if (arg[0] == '-')
		{
			const bool				isLongName	= arg[1] == '-';
			const char*				nameStart	= arg + (isLongName ? 2 : 1);
			const char*				nameEnd		= std::find(nameStart, arg+argLen, '=');
			const bool				hasImmValue	= nameEnd != (arg+argLen);
			const OptMap&			optMap		= isLongName ? longOptMap : shortOptMap;
			OptMap::const_iterator	optPos		= optMap.find(string(nameStart, nameEnd));
			const OptInfo*			opt			= optPos != optMap.end() ? optPos->second : DE_NULL;

			if (!opt)
			{
				err << "Unrecognized command line option '" << arg << "'\n";
				allOk = false;
				continue;
			}

			if (seenOpts.find(opt) != seenOpts.end())
			{
				err << "Command line option '--" << opt->longName << "' specified multiple times\n";
				allOk = false;
				continue;
			}

			seenOpts.insert(opt);

			if (opt->isFlag)
			{
				if (!hasImmValue)
				{
					opt->dispatchParse(opt, DE_NULL, &dst->m_options);
				}
				else
				{
					err << "No value expected for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
			else
			{
				const bool	hasValue	= hasImmValue || (argNdx+1 < numArgs);

				if (hasValue)
				{
					const char*	value	= hasValue ? (hasImmValue ? nameEnd+1 : args[argNdx+1]) : DE_NULL;

					if (!hasImmValue)
						argNdx += 1; // Skip value

					try
					{
						opt->dispatchParse(opt, value, &dst->m_options);
					}
					catch (const std::exception& e)
					{
						err << "Got error parsing command line option '--" << opt->longName << "': " << e.what() << "\n";
						allOk = false;
					}
				}
				else
				{
					err << "Expected value for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
		}
		else
		{
			// Not an option
			dst->m_args.push_back(arg);
		}
	}

	// Help specified?
	if (dst->m_options.get<Help>())
		allOk = false;

	return allOk;
}